

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::PrepareIntegralStream(Emitter *this,stringstream *stream)

{
  EMITTER_MANIP EVar1;
  long in_RSI;
  
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef8f88);
  EVar1 = EmitterState::GetIntFormat((EmitterState *)0xef8f90);
  if (EVar1 == Dec) {
    std::ostream::operator<<((void *)(in_RSI + 0x10),std::dec);
  }
  else if (EVar1 == Hex) {
    std::operator<<((ostream *)(in_RSI + 0x10),"0x");
    std::ostream::operator<<((void *)(in_RSI + 0x10),std::hex);
  }
  else if (EVar1 == Oct) {
    std::operator<<((ostream *)(in_RSI + 0x10),"0");
    std::ostream::operator<<((void *)(in_RSI + 0x10),std::oct);
  }
  return;
}

Assistant:

void Emitter::PrepareIntegralStream(std::stringstream& stream) const {

  switch (m_pState->GetIntFormat()) {
    case Dec:
      stream << std::dec;
      break;
    case Hex:
      stream << "0x";
      stream << std::hex;
      break;
    case Oct:
      stream << "0";
      stream << std::oct;
      break;
    default:
      assert(false);
  }
}